

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O3

void Js::ByteCodeDumper::DumpBrProperty
               (OpCode op,OpLayoutBrProperty *data,FunctionBody *dumpFunction,ByteCodeReader *reader
               )

{
  short sVar1;
  uint uVar2;
  PropertyId propertyId;
  ScriptContext *this;
  PropertyRecord *pPVar3;
  
  sVar1 = data->RelativeJumpOffset;
  uVar2 = ByteCodeReader::GetCurrentOffset(reader);
  Output::Print(L" x:%04x (%4d) ",(ulong)(uVar2 + (int)sVar1),(ulong)(uint)(int)sVar1);
  this = FunctionProxy::GetScriptContext((FunctionProxy *)dumpFunction);
  propertyId = FunctionBody::GetReferencedPropertyId(dumpFunction,data->PropertyIdIndex);
  pPVar3 = ScriptContext::GetPropertyName(this,propertyId);
  Output::Print(L"R%d.%s",(ulong)data->Instance,pPVar3 + 1);
  return;
}

Assistant:

void ByteCodeDumper::DumpBrProperty(OpCode op, const unaligned OpLayoutBrProperty * data, FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        DumpOffset(data->RelativeJumpOffset, reader);
        ScriptContext* scriptContext = dumpFunction->GetScriptContext();
        PropertyRecord const * pPropertyName = scriptContext->GetPropertyName(
            dumpFunction->GetReferencedPropertyId(data->PropertyIdIndex));
        Output::Print(_u("R%d.%s"), data->Instance, pPropertyName->GetBuffer());
    }